

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ObjCheckTfi(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *vVisited;
  void **ppvVar2;
  long lVar3;
  
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x71d,"int Gia_ObjCheckTfi(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    vVisited = (Vec_Ptr_t *)malloc(0x10);
    vVisited->nCap = 100;
    vVisited->nSize = 0;
    ppvVar2 = (void **)malloc(800);
    vVisited->pArray = ppvVar2;
    iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pNode,vVisited);
    if (0 < vVisited->nSize) {
      lVar3 = 0;
      do {
        *(ulong *)vVisited->pArray[lVar3] = *vVisited->pArray[lVar3] & 0xffffffffbfffffff;
        lVar3 = lVar3 + 1;
      } while (lVar3 < vVisited->nSize);
    }
    if (vVisited->pArray != (void **)0x0) {
      free(vVisited->pArray);
      vVisited->pArray = (void **)0x0;
    }
    free(vVisited);
    return iVar1;
  }
  __assert_fail("!Gia_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                ,0x71e,"int Gia_ObjCheckTfi(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ObjCheckTfi( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode )
{
    Vec_Ptr_t * vVisited;
    Gia_Obj_t * pObj;
    int RetValue, i;
    assert( !Gia_IsComplement(pOld) );
    assert( !Gia_IsComplement(pNode) );
    vVisited = Vec_PtrAlloc( 100 );
    RetValue = Gia_ObjCheckTfi_rec( p, pOld, pNode, vVisited );
    Vec_PtrForEachEntry( Gia_Obj_t *, vVisited, pObj, i )
        pObj->fMark0 = 0;
    Vec_PtrFree( vVisited );
    return RetValue;
}